

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

FlattenedField *
kj::_::
CopyConstructArray_<capnp::JsonCodec::AnnotatedHandler::FlattenedField,_capnp::JsonCodec::AnnotatedHandler::FlattenedField_*,_true,_false>
::apply(FlattenedField *pos,FlattenedField *start,FlattenedField *end)

{
  ExceptionGuard local_30;
  
  local_30.start = pos;
  for (; local_30.pos = pos, start != end; start = start + 1) {
    capnp::JsonCodec::AnnotatedHandler::FlattenedField::FlattenedField(pos,start);
    pos = local_30.pos + 1;
  }
  local_30.start = pos;
  ExceptionGuard::~ExceptionGuard(&local_30);
  return pos;
}

Assistant:

static T* apply(T* __restrict__ pos, Iterator start, Iterator end) {
    // Verify that T can be *implicitly* constructed from the source values.
    if (false) implicitCast<T>(kj::mv(*start));

    if (noexcept(T(kj::mv(*start)))) {
      while (start != end) {
        ctor(*pos++, kj::mv(*start++));
      }
      return pos;
    } else {
      // Crap.  This is complicated.
      ExceptionGuard guard(pos);
      while (start != end) {
        ctor(*guard.pos, kj::mv(*start++));
        ++guard.pos;
      }
      guard.start = guard.pos;
      return guard.pos;
    }
  }